

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qcolumnview.cpp
# Opt level: O0

void __thiscall QColumnViewPrivate::doLayout(QColumnViewPrivate *this)

{
  bool bVar1;
  int iVar2;
  int iVar3;
  int iVar4;
  QColumnView *pQVar5;
  const_reference ppQVar6;
  long lVar7;
  qsizetype qVar8;
  QColumnViewPrivate *in_RDI;
  int currentColumnWidth;
  QAbstractItemView *view_1;
  int i_1;
  QAbstractItemView *view;
  int i;
  int x;
  int viewportHeight;
  QColumnView *q;
  qsizetype in_stack_ffffffffffffff78;
  int in_stack_ffffffffffffff80;
  int in_stack_ffffffffffffff84;
  undefined8 in_stack_ffffffffffffff88;
  QWidget *in_stack_ffffffffffffff90;
  QWidget *pQVar9;
  undefined4 in_stack_ffffffffffffff98;
  undefined4 in_stack_ffffffffffffff9c;
  int local_2c;
  int local_1c;
  int local_18;
  
  pQVar5 = q_func(in_RDI);
  if (((in_RDI->super_QAbstractItemViewPrivate).model != (QAbstractItemModel *)0x0) &&
     (bVar1 = QList<QAbstractItemView_*>::isEmpty((QList<QAbstractItemView_*> *)0x8641bd), !bVar1))
  {
    iVar2 = QWidget::height((QWidget *)0x8641d9);
    QList<QAbstractItemView_*>::at
              ((QList<QAbstractItemView_*> *)
               CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
               in_stack_ffffffffffffff78);
    local_18 = QWidget::x(in_stack_ffffffffffffff90);
    bVar1 = QWidget::isRightToLeft((QWidget *)0x864208);
    if (bVar1) {
      local_18 = QWidget::width((QWidget *)0x864222);
      iVar3 = (**(code **)(*(long *)&(pQVar5->super_QAbstractItemView).super_QAbstractScrollArea.
                                     super_QFrame.super_QWidget + 0x2b0))();
      local_18 = local_18 + iVar3;
      for (local_1c = 0; qVar8 = QList<QAbstractItemView_*>::size(&in_RDI->columns),
          local_1c < qVar8; local_1c = local_1c + 1) {
        ppQVar6 = QList<QAbstractItemView_*>::at
                            ((QList<QAbstractItemView_*> *)
                             CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                             in_stack_ffffffffffffff78);
        pQVar9 = (QWidget *)*ppQVar6;
        iVar3 = QWidget::width((QWidget *)0x86429c);
        local_18 = local_18 - iVar3;
        iVar3 = QWidget::x(in_stack_ffffffffffffff90);
        if ((local_18 != iVar3) || (iVar3 = QWidget::height((QWidget *)0x8642d6), iVar2 != iVar3)) {
          iVar3 = local_18;
          QWidget::width((QWidget *)0x8642fc);
          QWidget::setGeometry
                    ((QWidget *)CONCAT44(iVar3,in_stack_ffffffffffffff98),
                     (int)((ulong)pQVar9 >> 0x20),(int)pQVar9,
                     (int)((ulong)in_stack_ffffffffffffff88 >> 0x20),(int)in_stack_ffffffffffffff88)
          ;
          in_stack_ffffffffffffff90 = pQVar9;
        }
      }
    }
    else {
      local_2c = 0;
      while( true ) {
        lVar7 = (long)local_2c;
        qVar8 = QList<QAbstractItemView_*>::size(&in_RDI->columns);
        if (qVar8 <= lVar7) break;
        QList<QAbstractItemView_*>::at
                  ((QList<QAbstractItemView_*> *)
                   CONCAT44(in_stack_ffffffffffffff84,in_stack_ffffffffffffff80),
                   in_stack_ffffffffffffff78);
        iVar3 = QWidget::width((QWidget *)0x864386);
        in_stack_ffffffffffffff84 = local_18;
        iVar4 = QWidget::x(in_stack_ffffffffffffff90);
        if ((in_stack_ffffffffffffff84 != iVar4) ||
           (in_stack_ffffffffffffff80 = iVar2, iVar4 = QWidget::height((QWidget *)0x8643b8),
           in_stack_ffffffffffffff80 != iVar4)) {
          QWidget::setGeometry
                    ((QWidget *)CONCAT44(in_stack_ffffffffffffff9c,in_stack_ffffffffffffff98),
                     (int)((ulong)in_stack_ffffffffffffff90 >> 0x20),(int)in_stack_ffffffffffffff90,
                     (int)((ulong)lVar7 >> 0x20),(int)lVar7);
        }
        local_18 = iVar3 + local_18;
        local_2c = local_2c + 1;
      }
    }
  }
  return;
}

Assistant:

void QColumnViewPrivate::doLayout()
{
    Q_Q(QColumnView);
    if (!model || columns.isEmpty())
        return;

    int viewportHeight = viewport->height();
    int x = columns.at(0)->x();

    if (q->isRightToLeft()) {
        x = viewport->width() + q->horizontalOffset();
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            x -= view->width();
            if (x != view->x() || viewportHeight != view->height())
                view->setGeometry(x, 0, view->width(), viewportHeight);
        }
    } else {
        for (int i = 0; i < columns.size(); ++i) {
            QAbstractItemView *view = columns.at(i);
            int currentColumnWidth = view->width();
            if (x != view->x() || viewportHeight != view->height())
                view->setGeometry(x, 0, currentColumnWidth, viewportHeight);
            x += currentColumnWidth;
        }
    }
}